

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O0

int test_deserialize(char *filename)

{
  FILE *__stream;
  char *x;
  roaring_bitmap_t *prVar1;
  char *__size;
  char *y;
  char *expression;
  char *in_RDI;
  int compare_result;
  size_t actual_size;
  char *output_buffer;
  size_t expected_size;
  roaring_bitmap_t *bitmap;
  char *input_buffer;
  size_t bytes;
  FILE *fp;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  FILE *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  int local_4;
  
  __stream = fopen(in_RDI,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Could not open %s, check your configuration. \n",in_RDI);
    _assert_true(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
                 (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
  }
  x = readfile(in_stack_ffffffffffffffb8,
               (size_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (x == (char *)0x0) {
    printf("Could not read bytes from %s, check your configuration. \n",in_RDI);
    _assert_true(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
                 (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
  }
  printf("Binary content read.\n");
  prVar1 = roaring_bitmap_portable_deserialize_safe
                     (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (prVar1 == (roaring_bitmap_t *)0x0) {
    printf("Null bitmap loaded.\n");
    free(x);
    local_4 = 1;
  }
  else {
    printf("Non-null bitmap loaded.\n");
    __size = (char *)roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x102642);
    y = (char *)malloc((size_t)__size);
    expression = (char *)roaring_bitmap_portable_serialize
                                   ((roaring_bitmap_t *)
                                    CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                    (char *)CONCAT44(in_stack_ffffffffffffffac,
                                                     in_stack_ffffffffffffffa8));
    if (expression != __size) {
      free(x);
      free(y);
      _assert_int_equal((unsigned_long)y,(unsigned_long)expression,
                        (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac);
    }
    local_4 = compare(x,y,(size_t)expression);
    free(y);
    free(x);
    fclose(__stream);
    roaring_bitmap_free((roaring_bitmap_t *)0x1026e5);
    _assert_true((unsigned_long)y,expression,(char *)CONCAT44(local_4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
  }
  return local_4;
}

Assistant:

int test_deserialize(const char* filename) {
    FILE* fp = fopen(filename, "rb");
    if (fp == NULL) {
        printf("Could not open %s, check your configuration. \n", filename);
        assert_false(fp == NULL);
    }
    size_t bytes;
    char* input_buffer = readfile(fp, &bytes);

    if (input_buffer == NULL) {
        printf("Could not read bytes from %s, check your configuration. \n",
               filename);
        assert_false(input_buffer == NULL);
    }
    printf("Binary content read.\n");

    roaring_bitmap_t* bitmap =
        roaring_bitmap_portable_deserialize_safe(input_buffer, bytes);

    if (bitmap == NULL) {
        printf("Null bitmap loaded.\n");
        free(input_buffer);
        return 1;  // this is the expected behavior
    }
    printf("Non-null bitmap loaded.\n");

    size_t expected_size = roaring_bitmap_portable_size_in_bytes(bitmap);

    char* output_buffer = (char*)malloc(expected_size);
    size_t actual_size =
        roaring_bitmap_portable_serialize(bitmap, output_buffer);

    if (actual_size != expected_size) {
        free(input_buffer);
        free(output_buffer);
        assert_int_equal(actual_size, expected_size);
    }

    int compare_result = compare(input_buffer, output_buffer, actual_size);

    free(output_buffer);
    free(input_buffer);
    fclose(fp);

    roaring_bitmap_free(bitmap);
    assert_false(compare_result);

    return compare_result;
}